

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityReissnerIsothropic::ComputeStiffnessMatrix
          (ChElasticityReissnerIsothropic *this,ChMatrixRef *mC,ChVector<double> *eps_u,
          ChVector<double> *eps_v,ChVector<double> *kur_u,ChVector<double> *kur_v,double z_inf,
          double z_sup,double angle)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  long lVar12;
  ActualDstType actualDst;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 in_XMM1_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double h;
  undefined1 auVar21 [16];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_a1;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  SrcEvaluatorType local_58;
  DstEvaluatorType local_48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_30;
  
  if ((mC->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 0xc) {
    __assert_fail("mC.rows() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                  ,0x98,
                  "virtual void chrono::fea::ChElasticityReissnerIsothropic::ComputeStiffnessMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  local_a0 = z_inf;
  local_68 = z_sup;
  if ((mC->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0xc) {
    __assert_fail("mC.cols() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                  ,0x99,
                  "virtual void chrono::fea::ChElasticityReissnerIsothropic::ComputeStiffnessMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  local_30.m_src = &local_58;
  local_58.m_functor.m_other = 0.0;
  local_48.
  super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  .m_data = (mC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data;
  local_30.m_dst = &local_48;
  local_48.
  super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  .m_outerStride.m_value =
       (mC->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  local_30.m_functor = &local_a1;
  uStack_60 = in_XMM1_Qb;
  local_30.m_dstExpr = mC;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_30);
  auVar10._8_8_ = uStack_60;
  auVar10._0_8_ = local_68;
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar10,auVar13);
  dVar15 = local_68 - local_a0;
  if ((auVar13._0_8_ != local_a0) || (NAN(auVar13._0_8_) || NAN(local_a0))) {
    local_78 = this->m_E;
    local_80 = this->m_nu;
    local_88 = this->m_alpha;
    local_98 = this->m_beta;
    local_70 = dVar15;
    local_90 = pow(local_68,3.0);
    dVar15 = pow(local_a0,3.0);
    lVar2 = (mC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    if ((0 < lVar2) &&
       (lVar3 = (mC->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value, 0 < lVar3)) {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_80;
      auVar13 = vfnmadd213sd_fma(auVar21,auVar21,ZEXT816(0x3ff0000000000000));
      dVar16 = local_78 / auVar13._0_8_;
      pdVar11 = (mC->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      *pdVar11 = local_70 * dVar16;
      if (4 < lVar3) {
        dVar1 = local_80 * dVar16;
        pdVar11[4] = local_70 * dVar1;
        if (7 < lVar3) {
          dVar5 = (local_68 * local_68 - local_a0 * local_a0) * 0.5;
          dVar14 = dVar5 * dVar16;
          pdVar11[7] = dVar14;
          if (9 < lVar3) {
            dVar6 = dVar5 * dVar1;
            pdVar11[9] = dVar6;
            if (lVar2 != 1) {
              dVar17 = local_78 / (local_80 + 1.0 + local_80 + 1.0);
              dVar4 = dVar17 + dVar17;
              lVar12 = (mC->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).m_stride.m_outer.m_value;
              pdVar11[lVar12 + 1] = local_70 * dVar4;
              dVar5 = dVar5 * dVar4;
              pdVar11[lVar12 + 6] = dVar5;
              if (2 < lVar2) {
                dVar7 = local_70 * (local_88 + local_88) * dVar17;
                pdVar11[lVar12 * 2 + 2] = dVar7;
                if (((lVar2 != 3) && (pdVar11[lVar12 * 3 + 3] = local_70 * dVar4, lVar3 != 10)) &&
                   (pdVar11[lVar12 * 3 + 10] = dVar5, 4 < lVar2)) {
                  pdVar11[lVar12 * 4] = local_70 * dVar1;
                  pdVar11[lVar12 * 4 + 4] = local_70 * dVar16;
                  pdVar11[lVar12 * 4 + 7] = dVar6;
                  pdVar11[lVar12 * 4 + 9] = dVar14;
                  if ((lVar2 != 5) && (pdVar11[lVar12 * 5 + 5] = dVar7, 6 < lVar2)) {
                    dVar15 = (local_90 - dVar15) * 0.3333333333333333;
                    pdVar11[lVar12 * 6 + 1] = dVar5;
                    pdVar11[lVar12 * 6 + 6] = dVar4 * dVar15;
                    if (lVar2 != 7) {
                      pdVar11[lVar12 * 7] = dVar14;
                      pdVar11[lVar12 * 7 + 4] = dVar6;
                      pdVar11[lVar12 * 7 + 7] = dVar16 * dVar15;
                      pdVar11[lVar12 * 7 + 9] = dVar1 * dVar15;
                      if (8 < lVar2) {
                        dVar17 = (local_98 + local_98) * dVar17 * dVar15;
                        pdVar11[lVar12 * 8 + 8] = dVar17;
                        if (lVar2 != 9) {
                          pdVar11[lVar12 * 9] = dVar6;
                          pdVar11[lVar12 * 9 + 4] = dVar14;
                          pdVar11[lVar12 * 9 + 7] = dVar1 * dVar15;
                          pdVar11[lVar12 * 9 + 9] = dVar16 * dVar15;
                          if (10 < lVar2) {
                            pdVar11[lVar12 * 10 + 3] = dVar5;
                            pdVar11[lVar12 * 10 + 10] = dVar4 * dVar15;
                            if ((lVar2 != 0xb) && (0xb < lVar3)) goto LAB_0065728f;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    lVar2 = (mC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    if ((0 < lVar2) &&
       (lVar3 = (mC->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value, 0 < lVar3)) {
      dVar16 = this->m_E;
      dVar1 = this->m_nu;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar1;
      auVar13 = vfnmadd213sd_fma(auVar18,auVar18,ZEXT816(0x3ff0000000000000));
      dVar14 = (dVar15 * dVar16) / auVar13._0_8_;
      pdVar11 = (mC->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      *pdVar11 = dVar14;
      if ((4 < lVar3) && (pdVar11[4] = dVar14 * this->m_nu, 4 < lVar2)) {
        dVar1 = dVar1 + 1.0;
        dVar16 = dVar16 / (dVar1 + dVar1);
        lVar12 = (mC->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        pdVar11[lVar12 * 4] = dVar14 * this->m_nu;
        dVar1 = dVar15 * (dVar16 + dVar16);
        pdVar11[lVar12 + 1] = dVar1;
        pdVar11[lVar12 * 2 + 2] = dVar15 * dVar16 * this->m_alpha;
        pdVar11[lVar12 * 3 + 3] = dVar1;
        pdVar11[lVar12 * 4 + 4] = dVar14;
        if ((lVar2 != 5) &&
           (((lVar3 != 5 && (pdVar11[lVar12 * 5 + 5] = dVar15 * dVar16 * this->m_alpha, 6 < lVar2))
            && (6 < lVar3)))) {
          dVar17 = (dVar15 * dVar15 * dVar15 * dVar16) / 12.0;
          pdVar11[lVar12 * 6 + 6] = dVar17 + dVar17;
          if ((7 < lVar2) && (7 < lVar3)) {
            dVar15 = (dVar15 * dVar15 * dVar14) / 12.0;
            pdVar11[lVar12 * 7 + 7] = dVar15;
            if (9 < lVar3) {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = this->m_nu;
              auVar8._8_8_ = 0x8000000000000000;
              auVar8._0_8_ = 0x8000000000000000;
              auVar13 = vxorpd_avx512vl(auVar19,auVar8);
              pdVar11[lVar12 * 7 + 9] = dVar15 * auVar13._0_8_;
              if (9 < lVar2) {
                auVar20._8_8_ = 0;
                auVar20._0_8_ = this->m_nu;
                auVar9._8_8_ = 0x8000000000000000;
                auVar9._0_8_ = 0x8000000000000000;
                auVar13 = vxorpd_avx512vl(auVar20,auVar9);
                pdVar11[lVar12 * 9 + 7] = dVar15 * auVar13._0_8_;
                pdVar11[lVar12 * 8 + 8] = dVar17 * this->m_beta;
                pdVar11[lVar12 * 9 + 9] = dVar15;
                if (((lVar2 != 10) && (lVar3 != 10)) &&
                   ((pdVar11[lVar12 * 10 + 10] = dVar17 + dVar17, 0xb < lVar2 && (0xb < lVar3)))) {
                  dVar17 = dVar17 * this->m_beta;
LAB_0065728f:
                  pdVar11[lVar12 * 0xb + 0xb] = dVar17;
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChElasticityReissnerIsothropic::ComputeStiffnessMatrix(ChMatrixRef mC,
                                                        const ChVector<>& eps_u,
                                                        const ChVector<>& eps_v,
                                                        const ChVector<>& kur_u,
                                                        const ChVector<>& kur_v,
                                                        const double z_inf,
                                                        const double z_sup,
                                                        const double angle) {
    assert(mC.rows() == 12);
    assert(mC.cols() == 12);

    mC.setZero();

    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;
        mC(0, 0) = C;
        mC(0, 4) = m_nu * C;
        mC(4, 0) = m_nu * C;
        mC(1, 1) = 2. * G * h;
        mC(2, 2) = m_alpha * G * h;
        mC(3, 3) = 2. * G * h;
        mC(4, 4) = C;
        mC(5, 5) = m_alpha * G * h;
        mC(6, 6) = 2. * F;
        mC(7, 7) = D;
        mC(7, 9) = -m_nu * D;
        mC(9, 7) = -m_nu * D;
        mC(8, 8) = m_beta * F;
        mC(9, 9) = D;
        mC(10, 10) = 2. * F;
        mC(11, 11) = m_beta * F;
    } else {
        // throw ChException("ComputeStiffnessMatrix not yet implemented for non-centered layers");
        double G = m_E / (2. * (1. + m_nu));
        double Q11 = m_E / (1. - m_nu * m_nu);
        double Q22 = Q11;
        double Q12 = m_nu * Q11;
        double Q33 = 2 * G;
        double Q44 = 2 * G;
        double Qss = m_alpha * 2 * G;
        double Qdd = m_beta * 2 * G;
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));

        mC(0, 0) = h1 * Q11;
        mC(0, 4) = h1 * Q12;
        mC(0, 7) = h2 * Q11;
        mC(0, 9) = h2 * Q12;
        mC(1, 1) = h1 * Q33;
        mC(1, 6) = h2 * Q33;
        mC(2, 2) = h1 * Qss;
        mC(3, 3) = h1 * Q44;
        mC(3, 10) = h2 * Q44;
        mC(4, 0) = h1 * Q12;
        mC(4, 4) = h1 * Q22;
        mC(4, 7) = h2 * Q12;
        mC(4, 9) = h2 * Q22;
        mC(5, 5) = h1 * Qss;
        mC(6, 1) = h2 * Q33;
        mC(6, 6) = h3 * Q33;
        mC(7, 0) = h2 * Q11;
        mC(7, 4) = h2 * Q12;
        mC(7, 7) = h3 * Q11;
        mC(7, 9) = h3 * Q12;
        mC(8, 8) = h3 * Qdd;
        mC(9, 0) = h2 * Q12;
        mC(9, 4) = h2 * Q22;
        mC(9, 7) = h3 * Q12;
        mC(9, 9) = h3 * Q22;
        mC(10, 3) = h2 * Q44;
        mC(10, 10) = h3 * Q44;
        mC(11, 11) = h3 * Qdd;
    }
}